

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

int get_blend_factor(char *value)

{
  int iVar1;
  char *in_RDI;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  iVar1 = strcmp(in_RDI,"ALLEGRO_ZERO");
  if (iVar1 == 0) {
    local_c = 0;
  }
  else {
    iVar1 = strcmp(in_RDI,"ALLEGRO_ONE");
    if (iVar1 == 0) {
      local_10 = 1;
    }
    else {
      iVar1 = strcmp(in_RDI,"ALLEGRO_ALPHA");
      if (iVar1 == 0) {
        local_14 = 2;
      }
      else {
        iVar1 = strcmp(in_RDI,"ALLEGRO_INVERSE_ALPHA");
        if (iVar1 == 0) {
          local_18 = 3;
        }
        else {
          iVar1 = strcmp(in_RDI,"ALLEGRO_SRC_COLOR");
          if (iVar1 == 0) {
            local_1c = 4;
          }
          else {
            iVar1 = strcmp(in_RDI,"ALLEGRO_DEST_COLOR");
            if (iVar1 == 0) {
              local_20 = 5;
            }
            else {
              iVar1 = strcmp(in_RDI,"ALLEGRO_INVERSE_SRC_COLOR");
              if (iVar1 == 0) {
                local_24 = 6;
              }
              else {
                iVar1 = strcmp(in_RDI,"ALLEGRO_INVERSE_DEST_COLOR");
                if (iVar1 == 0) {
                  local_28 = 7;
                }
                else {
                  iVar1 = strcmp(in_RDI,"ALLEGRO_CONST_COLOR");
                  if (iVar1 == 0) {
                    local_2c = 8;
                  }
                  else {
                    iVar1 = strcmp(in_RDI,"ALLEGRO_INVERSE_CONST_COLOR");
                    if (iVar1 == 0) {
                      local_30 = 9;
                    }
                    else {
                      local_30 = atoi(in_RDI);
                    }
                    local_2c = local_30;
                  }
                  local_28 = local_2c;
                }
                local_24 = local_28;
              }
              local_20 = local_24;
            }
            local_1c = local_20;
          }
          local_18 = local_1c;
        }
        local_14 = local_18;
      }
      local_10 = local_14;
    }
    local_c = local_10;
  }
  return local_c;
}

Assistant:

static int get_blend_factor(char const *value)
{
   return streq(value, "ALLEGRO_ZERO") ? ALLEGRO_ZERO
      : streq(value, "ALLEGRO_ONE") ? ALLEGRO_ONE
      : streq(value, "ALLEGRO_ALPHA") ? ALLEGRO_ALPHA
      : streq(value, "ALLEGRO_INVERSE_ALPHA") ? ALLEGRO_INVERSE_ALPHA
      : streq(value, "ALLEGRO_SRC_COLOR") ? ALLEGRO_SRC_COLOR
      : streq(value, "ALLEGRO_DEST_COLOR") ? ALLEGRO_DEST_COLOR
      : streq(value, "ALLEGRO_INVERSE_SRC_COLOR") ? ALLEGRO_INVERSE_SRC_COLOR
      : streq(value, "ALLEGRO_INVERSE_DEST_COLOR") ? ALLEGRO_INVERSE_DEST_COLOR
      : streq(value, "ALLEGRO_CONST_COLOR") ? ALLEGRO_CONST_COLOR
      : streq(value, "ALLEGRO_INVERSE_CONST_COLOR") ? ALLEGRO_INVERSE_CONST_COLOR
      : atoi(value);
}